

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall
Omega_h::interpolate_between_metrics(Omega_h *this,LO nmetrics,Reals *a,Reals *b,Real t)

{
  void *extraout_RDX;
  Reals RVar1;
  Read<double> local_c0;
  Read<double> local_b0;
  Read<double> local_a0;
  undefined1 local_90 [8];
  Reals log_c;
  undefined1 local_70 [8];
  Reals log_b;
  Read<double> local_50;
  undefined1 local_40 [8];
  Reals log_a;
  Real t_local;
  Reals *b_local;
  Reals *a_local;
  LO nmetrics_local;
  
  log_a.write_.shared_alloc_.direct_ptr = (void *)t;
  Read<double>::Read(&local_50,a);
  linearize_metrics((Omega_h *)local_40,nmetrics,&local_50);
  Read<double>::~Read(&local_50);
  Read<double>::Read((Read<double> *)&log_c.write_.shared_alloc_.direct_ptr,b);
  linearize_metrics((Omega_h *)local_70,nmetrics,(Reals *)&log_c.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&log_c.write_.shared_alloc_.direct_ptr);
  Read<double>::Read(&local_a0,(Read<double> *)local_40);
  Read<double>::Read(&local_b0,(Read<double> *)local_70);
  interpolate_between((Omega_h *)local_90,&local_a0,&local_b0,
                      (Real)log_a.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read(&local_b0);
  Read<double>::~Read(&local_a0);
  Read<double>::Read(&local_c0,(Read<double> *)local_90);
  delinearize_metrics(this,nmetrics,&local_c0);
  Read<double>::~Read(&local_c0);
  Read<double>::~Read((Read<double> *)local_90);
  Read<double>::~Read((Read<double> *)local_70);
  Read<double>::~Read((Read<double> *)local_40);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals interpolate_between_metrics(LO nmetrics, Reals a, Reals b, Real t) {
  auto log_a = linearize_metrics(nmetrics, a);
  auto log_b = linearize_metrics(nmetrics, b);
  auto log_c = interpolate_between(log_a, log_b, t);
  return delinearize_metrics(nmetrics, log_c);
}